

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.h
# Opt level: O3

void cnpy::npz_save<std::complex<double>>
               (string *zipname,string *fname,complex<double> *data,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *shape,string *mode)

{
  pointer puVar1;
  pointer pcVar2;
  int iVar3;
  undefined4 uVar4;
  uint uVar5;
  FILE *__stream;
  pointer pcVar6;
  pointer puVar7;
  runtime_error *this;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *extraout_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *extraout_RDX_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *shape_00;
  ulong uVar8;
  size_t __n;
  uint16_t nrecs;
  vector<char,_std::allocator<char>_> local_header;
  vector<char,_std::allocator<char>_> global_header;
  size_t global_header_offset;
  vector<char,_std::allocator<char>_> footer;
  vector<char,_std::allocator<char>_> npy_header;
  ushort local_ea;
  vector<char,_std::allocator<char>_> local_e8;
  vector<char,_std::allocator<char>_> local_c8;
  ulong local_b0;
  vector<char,_std::allocator<char>_> local_a8;
  vector<char,_std::allocator<char>_> local_90;
  complex<double> *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_78 = data;
  std::__cxx11::string::append((char *)fname);
  local_ea = 0;
  local_b0 = 0;
  local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  iVar3 = std::__cxx11::string::compare((char *)mode);
  if (iVar3 == 0) {
    __stream = fopen((zipname->_M_dataplus)._M_p,"r+b");
    if (__stream != (FILE *)0x0) {
      cnpy::parse_zip_footer(__stream,&local_ea,(ulong *)&local_90,&local_b0);
      fseek(__stream,local_b0,0);
      std::vector<char,_std::allocator<char>_>::resize
                (&local_c8,
                 (size_type)
                 local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      pcVar6 = (pointer)fread(local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,1,
                              (size_t)local_90.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start,__stream);
      if (pcVar6 != local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this,"npz_save: header read error while adding to existing zip");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      fseek(__stream,local_b0,0);
      shape_00 = extraout_RDX_00;
      goto LAB_00104d02;
    }
  }
  __stream = fopen((zipname->_M_dataplus)._M_p,"wb");
  shape_00 = extraout_RDX;
LAB_00104d02:
  create_npy_header<std::complex<double>>(&local_90,(cnpy *)shape,shape_00);
  puVar7 = (shape->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (shape->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar7 == puVar1) {
    __n = 1;
  }
  else {
    iVar3 = 1;
    do {
      iVar3 = iVar3 * (int)*puVar7;
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar1);
    __n = (size_t)iVar3;
  }
  uVar8 = (long)local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  uVar4 = crc32(0,local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,uVar8 & 0xffffffff);
  uVar5 = crc32(uVar4,local_78,__n * 0x10 & 0xffffffff);
  local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cnpy::operator+=((vector *)&local_e8,"PK");
  operator+=(&local_e8,0x403);
  operator+=(&local_e8,0x14);
  operator+=(&local_e8,0);
  operator+=(&local_e8,0);
  operator+=(&local_e8,0);
  operator+=(&local_e8,0);
  operator+=(&local_e8,uVar5);
  uVar5 = (int)uVar8 + (int)(__n * 0x10);
  operator+=(&local_e8,uVar5);
  operator+=(&local_e8,uVar5);
  operator+=(&local_e8,(unsigned_short)fname->_M_string_length);
  operator+=(&local_e8,0);
  pcVar2 = (fname->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar2,pcVar2 + fname->_M_string_length);
  cnpy::operator+=(&local_e8,local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  cnpy::operator+=((vector *)&local_c8,"PK");
  operator+=(&local_c8,0x201);
  operator+=(&local_c8,0x14);
  std::vector<char,std::allocator<char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((vector<char,std::allocator<char>> *)&local_c8,
             local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,
             local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + 4,
             local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + 0x1e);
  operator+=(&local_c8,0);
  operator+=(&local_c8,0);
  operator+=(&local_c8,0);
  operator+=(&local_c8,0);
  operator+=(&local_c8,(uint)local_b0);
  pcVar2 = (fname->_M_dataplus)._M_p;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar2,pcVar2 + fname->_M_string_length);
  cnpy::operator+=(&local_c8,local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cnpy::operator+=((vector *)&local_a8,"PK");
  operator+=(&local_a8,0x605);
  operator+=(&local_a8,0);
  operator+=(&local_a8,0);
  operator+=(&local_a8,local_ea + 1);
  operator+=(&local_a8,local_ea + 1);
  operator+=(&local_a8,
             (int)local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
             (int)local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start);
  operator+=(&local_a8,
             (uVar5 + (uint)local_b0 +
             (int)local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish) -
             (int)local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start);
  operator+=(&local_a8,0);
  fwrite(local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start,1,
         (long)local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,__stream);
  fwrite(local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start,1,
         (long)local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,__stream);
  fwrite(local_78,0x10,__n,__stream);
  fwrite(local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start,1,
         (long)local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,__stream);
  fwrite(local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start,1,
         (long)local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,__stream);
  fclose(__stream);
  if (local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void npz_save(std::string zipname, std::string fname, const T* data, const std::vector<size_t>& shape, std::string mode = "w")
    {
        //first, append a .npy to the fname
        fname += ".npy";

        //now, on with the show
        FILE* fp = NULL;
        uint16_t nrecs = 0;
        size_t global_header_offset = 0;
        std::vector<char> global_header;

        if(mode == "a") fp = fopen(zipname.c_str(),"r+b");

        if(fp) {
            //zip file exists. we need to add a new npy file to it.
            //first read the footer. this gives us the offset and size of the global header
            //then read and store the global header.
            //below, we will write the the new data at the start of the global header then append the global header and footer below it
            size_t global_header_size;
            parse_zip_footer(fp,nrecs,global_header_size,global_header_offset);
            fseek(fp,global_header_offset,SEEK_SET);
            global_header.resize(global_header_size);
            size_t res = fread(&global_header[0],sizeof(char),global_header_size,fp);
            if(res != global_header_size){
                throw std::runtime_error("npz_save: header read error while adding to existing zip");
            }
            fseek(fp,global_header_offset,SEEK_SET);
        }
        else {
            fp = fopen(zipname.c_str(),"wb");
        }

        std::vector<char> npy_header = create_npy_header<T>(shape);

        size_t nels = std::accumulate(shape.begin(),shape.end(),1,std::multiplies<size_t>());
        size_t nbytes = nels*sizeof(T) + npy_header.size();

        //get the CRC of the data to be added
        uint32_t crc = crc32(0L,(uint8_t*)&npy_header[0],npy_header.size());
        crc = crc32(crc,(uint8_t*)data,nels*sizeof(T));

        //build the local header
        std::vector<char> local_header;
        local_header += "PK"; //first part of sig
        local_header += (uint16_t) 0x0403; //second part of sig
        local_header += (uint16_t) 20; //min version to extract
        local_header += (uint16_t) 0; //general purpose bit flag
        local_header += (uint16_t) 0; //compression method
        local_header += (uint16_t) 0; //file last mod time
        local_header += (uint16_t) 0;     //file last mod date
        local_header += (uint32_t) crc; //crc
        local_header += (uint32_t) nbytes; //compressed size
        local_header += (uint32_t) nbytes; //uncompressed size
        local_header += (uint16_t) fname.size(); //fname length
        local_header += (uint16_t) 0; //extra field length
        local_header += fname;

        //build global header
        global_header += "PK"; //first part of sig
        global_header += (uint16_t) 0x0201; //second part of sig
        global_header += (uint16_t) 20; //version made by
        global_header.insert(global_header.end(),local_header.begin()+4,local_header.begin()+30);
        global_header += (uint16_t) 0; //file comment length
        global_header += (uint16_t) 0; //disk number where file starts
        global_header += (uint16_t) 0; //internal file attributes
        global_header += (uint32_t) 0; //external file attributes
        global_header += (uint32_t) global_header_offset; //relative offset of local file header, since it begins where the global header used to begin
        global_header += fname;

        //build footer
        std::vector<char> footer;
        footer += "PK"; //first part of sig
        footer += (uint16_t) 0x0605; //second part of sig
        footer += (uint16_t) 0; //number of this disk
        footer += (uint16_t) 0; //disk where footer starts
        footer += (uint16_t) (nrecs+1); //number of records on this disk
        footer += (uint16_t) (nrecs+1); //total number of records
        footer += (uint32_t) global_header.size(); //nbytes of global headers
        footer += (uint32_t) (global_header_offset + nbytes + local_header.size()); //offset of start of global headers, since global header now starts after newly written array
        footer += (uint16_t) 0; //zip file comment length

        //write everything
        fwrite(&local_header[0],sizeof(char),local_header.size(),fp);
        fwrite(&npy_header[0],sizeof(char),npy_header.size(),fp);
        fwrite(data,sizeof(T),nels,fp);
        fwrite(&global_header[0],sizeof(char),global_header.size(),fp);
        fwrite(&footer[0],sizeof(char),footer.size(),fp);
        fclose(fp);
    }